

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump2.cpp
# Opt level: O3

void __thiscall DumpParams::resolveLineFormat(DumpParams *this)

{
  int iVar1;
  uint uVar2;
  
  if (this->unitsPerLine != 0) {
    return;
  }
  uVar2 = this->dumpUnitSize - 1;
  iVar1 = 0;
  if ((uVar2 < 8) && (iVar1 = 0, (0x8bU >> (uVar2 & 0x1f) & 1) != 0)) {
    iVar1 = *(int *)(&DAT_001055d4 + (ulong)uVar2 * 4);
    this->unitsPerLine = *(int *)(&DAT_001055b4 + (ulong)uVar2 * 4);
  }
  if (this->dumpformat != 0) {
    if (this->dumpformat != 2) {
      return;
    }
    iVar1 = 0x40;
  }
  this->unitsPerLine = iVar1;
  return;
}

Assistant:

void resolveLineFormat()
    {
        if (unitsPerLine==0) {
            switch(dumpUnitSize)
            {
                case 1: unitsPerLine = 32; break;
                case 2: unitsPerLine = 16; break;
                case 4: unitsPerLine = 8; break;
                case 8: unitsPerLine = 4; break;
            }
            switch(dumpformat)
            {
                case DUMP_BOTH:
                    unitsPerLine /= 2;
                    break;
                case DUMP_ASCII:
                    unitsPerLine = 64;
                    break;
            }
        }

    }